

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

TString * luaX_newstring(LexState *ls,char *str,size_t l)

{
  lua_State *L;
  Table *t;
  TValue *i_o_1;
  Value key;
  TValue *pTVar1;
  TValue *i_o;
  Value local_28;
  undefined4 local_20;
  
  L = ls->L;
  key.gc = (GCObject *)luaS_newlstr(L,str,l);
  t = ls->fs->h;
  pTVar1 = luaH_getstr(t,(TString *)key.gc);
  if (pTVar1 == &luaO_nilobject_) {
    local_20 = 4;
    local_28.gc = key.gc;
    pTVar1 = newkey(L,t,(TValue *)&local_28);
  }
  if (pTVar1->tt == 0) {
    (pTVar1->value).b = 1;
    pTVar1->tt = 1;
    if (L->l_G->GCthreshold <= L->l_G->totalbytes) {
      luaC_step(L);
    }
  }
  return (TString *)(GCObject *)key;
}

Assistant:

static TString*luaX_newstring(LexState*ls,const char*str,size_t l){
lua_State*L=ls->L;
TString*ts=luaS_newlstr(L,str,l);
TValue*o=luaH_setstr(L,ls->fs->h,ts);
if(ttisnil(o)){
setbvalue(o,1);
luaC_checkGC(L);
}
return ts;
}